

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minAbsColscale(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *__return_storage_ptr__,
                SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  DataArray<int> *pDVar1;
  type_conflict5 tVar2;
  double in_RAX;
  double *pdVar3;
  int i;
  long lVar4;
  double dVar5;
  double local_28;
  
  pDVar1 = this->m_activeColscaleExp;
  local_28 = in_RAX;
  pdVar3 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,*pdVar3,(type *)0x0);
  for (lVar4 = 0; lVar4 < pDVar1->thesize; lVar4 = lVar4 + 1) {
    local_28 = ldexp(1.0,pDVar1->data[lVar4]);
    local_28 = ABS(local_28);
    tVar2 = boost::multiprecision::operator<(&local_28,__return_storage_ptr__);
    if (tVar2) {
      dVar5 = ldexp(1.0,pDVar1->data[lVar4]);
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,ABS(dVar5));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::minAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R mini = R(infinity);

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) < mini)
         mini = spxAbs(spxLdexp(1.0, colscaleExp[i]));

   return mini;
}